

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

void __thiscall
Diligent::GetShaderVariableTypeLiteralName::VarTypeToLiteralNameMap::VarTypeToLiteralNameMap
          (VarTypeToLiteralNameMap *this)

{
  reference ppcVar1;
  VarTypeToLiteralNameMap *this_local;
  
  memset(this,0,0x18);
  memset(&this->FullVarTypeNameStrings,0,0x18);
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->ShortVarTypeNameStrings,0);
  *ppcVar1 = "static";
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->ShortVarTypeNameStrings,1);
  *ppcVar1 = "mutable";
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->ShortVarTypeNameStrings,2);
  *ppcVar1 = "dynamic";
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->FullVarTypeNameStrings,0);
  *ppcVar1 = "SHADER_RESOURCE_VARIABLE_TYPE_STATIC";
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->FullVarTypeNameStrings,1);
  *ppcVar1 = "SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE";
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->FullVarTypeNameStrings,2);
  *ppcVar1 = "SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC";
  return;
}

Assistant:

VarTypeToLiteralNameMap()
        {
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]  = "static";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE] = "mutable";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC] = "dynamic";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]   = "SHADER_RESOURCE_VARIABLE_TYPE_STATIC";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE]  = "SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC]  = "SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC";

            static_assert(SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES == 3, "Not all shader variable types initialized.");
        }